

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O3

void __thiscall avro::json::JsonGenerator::escape(JsonGenerator *this,char c,char *b,char *p)

{
  uint8_t *puVar1;
  
  if (b != p) {
    StreamWriter::writeBytes(&this->out_,(uint8_t *)b,(long)p - (long)b);
  }
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '\\';
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = c;
  return;
}

Assistant:

void escape(char c, const char* b, const char *p) {
        write(b, p);
        out_.write('\\');
        out_.write(c);
    }